

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
BailOutRecord::DumpArgOffsets(BailOutRecord *this,uint count,int *offsets,int argOutSlotStart)

{
  int offset;
  code *pcVar1;
  BOOLEAN BVar2;
  BOOLEAN BVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  BVIndex i;
  
  if (count != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar6 = 0;
    do {
      offset = offsets[uVar6];
      i = argOutSlotStart + (int)uVar6;
      BVar2 = BVFixed::Test(this->argOutOffsetInfo->argOutFloat64Syms,i);
      BVar3 = BVFixed::Test(this->argOutOffsetInfo->argOutLosslessInt32Syms,i);
      if ((BVar2 != '\0') && (BVar3 != '\0')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x215,"(!isFloat64 || !isInt32)","!isFloat64 || !isInt32");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      Output::Print(L"%s #%3d: ",L"OutParam",uVar6 & 0xffffffff);
      DumpValue(this,offset,BVar2 != '\0');
      Output::Print(L"\n");
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  return;
}

Assistant:

void BailOutRecord::DumpArgOffsets(uint count, int* offsets, int argOutSlotStart)
{
    char16 const * name = _u("OutParam");
    Js::RegSlot regSlotOffset = 0;

    for (uint i = 0; i < count; i++)
    {
        int offset = offsets[i];

        // The variables below determine whether we have a Var or native float/int.
        bool isFloat64 = this->argOutOffsetInfo->argOutFloat64Syms->Test(argOutSlotStart + i) != 0;
        bool isInt32 = this->argOutOffsetInfo->argOutLosslessInt32Syms->Test(argOutSlotStart + i) != 0;
        Assert(!isFloat64 || !isInt32);

        Output::Print(_u("%s #%3d: "), name, i + regSlotOffset);
        this->DumpValue(offset, isFloat64);
        Output::Print(_u("\n"));
    }
}